

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int sat_solver2_addclause(sat_solver2 *s,lit *begin,lit *end,int Id)

{
  uint *end_00;
  char cVar1;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint *begin_00;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  uint *end_01;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  clause *c;
  
  if ((s->trail_lim).size != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50d,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (Id == 0) {
    __assert_fail("Id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50e,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  begin_00 = (uint *)(s->temp_clause).ptr;
  do {
    uVar15 = *begin;
    uVar7 = (s->temp_clause).size;
    if (uVar7 == (s->temp_clause).cap) {
      iVar8 = (uVar7 >> 1) * 3;
      if ((int)uVar7 < 4) {
        iVar8 = uVar7 * 2;
      }
      if (begin_00 == (uint *)0x0) {
        begin_00 = (uint *)malloc((long)iVar8 << 2);
      }
      else {
        begin_00 = (uint *)realloc(begin_00,(long)iVar8 << 2);
      }
      (s->temp_clause).ptr = (int *)begin_00;
      if (begin_00 == (uint *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar8 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->temp_clause).cap = iVar8;
      uVar7 = (s->temp_clause).size;
    }
    (s->temp_clause).size = uVar7 + 1;
    begin_00[(int)uVar7] = uVar15;
    begin = (lit *)((uint *)begin + 1);
  } while (begin < end);
  iVar8 = (s->temp_clause).size;
  iVar14 = (int)*begin_00 >> 1;
  end_00 = begin_00 + 1;
  puVar12 = end_00;
  if ((long)iVar8 < 2) {
    sat_solver2_setnvars(s,iVar14 + 1);
  }
  else {
    end_01 = begin_00 + iVar8;
    puVar9 = end_00;
    do {
      uVar15 = *puVar9;
      puVar5 = puVar9;
      iVar6 = (int)uVar15 >> 1;
      if ((int)uVar15 >> 1 <= iVar14) {
        iVar6 = iVar14;
      }
      for (; (iVar14 = iVar6, begin_00 < puVar5 && ((int)uVar15 < (int)puVar5[-1]));
          puVar5 = puVar5 + -1) {
        *puVar5 = puVar5[-1];
        iVar6 = iVar14;
      }
      *puVar5 = uVar15;
      puVar9 = puVar9 + 1;
    } while (puVar9 < end_01);
    sat_solver2_setnvars(s,iVar14 + 1);
    puVar9 = end_00;
    if (1 < iVar8) {
      do {
        uVar15 = *puVar9;
        if ((uVar15 ^ puVar9[-1]) == 1) goto LAB_008e5cbb;
        if (puVar9[-1] != uVar15) {
          *puVar12 = uVar15;
          puVar12 = puVar12 + 1;
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 < end_01);
    }
  }
  if (puVar12 <= begin_00) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x52c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  lVar11 = 0;
  puVar9 = (uint *)0x0;
  uVar15 = 0;
  do {
    uVar7 = *(uint *)((long)begin_00 + lVar11);
    if ((lVar11 != 0) && ((*(uint *)((long)begin_00 + lVar11 + -4) ^ uVar7) < 2)) {
      __assert_fail("i == begin || lit_var(*(i-1)) != lit_var(*i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x533,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
    }
    cVar1 = s->assigns[(int)uVar7 >> 1];
    end_01 = puVar12;
    if ((uVar7 & 1) == (int)cVar1) {
LAB_008e5cbb:
      iVar8 = clause2_create_new(s,(lit *)begin_00,(lit *)end_01,0,0);
      return iVar8;
    }
    if (cVar1 == '\x03') {
      puVar9 = (uint *)((long)begin_00 + lVar11);
    }
    uVar15 = uVar15 + (cVar1 != '\x03');
    lVar4 = lVar11 + 4;
    lVar11 = lVar11 + 4;
  } while ((uint *)((long)begin_00 + lVar4) < puVar12);
  uVar13 = (long)puVar12 - (long)begin_00 >> 2;
  if ((long)uVar13 <= (long)(ulong)uVar15) {
    __assert_fail("count < end-begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x53c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  uVar7 = *puVar9;
  *puVar9 = *begin_00;
  *begin_00 = uVar7;
  uVar7 = clause2_create_new(s,(lit *)begin_00,(lit *)puVar12,0,0);
  uVar10 = (s->Mem).uPageMask & uVar7;
  if (uVar10 == 0) {
LAB_008e5e51:
    __assert_fail("k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                  ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
  }
  ppiVar2 = (s->Mem).pPages;
  puVar12 = (uint *)(ppiVar2[(int)uVar7 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar10);
  puVar12[(ulong)(*puVar12 >> 0xb) + 1] = Id;
  if ((uVar13 == uVar15 + 1) && (s->fProofLogging != 0)) {
    if (uVar15 == 0) {
      uVar15 = (int)*begin_00 >> 1;
      if (((int)uVar15 < 0) || (s->size <= (int)uVar15)) {
LAB_008e5e8f:
        __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
      }
      if (s->units[uVar15] != 0) goto LAB_008e5e8f;
      s->units[uVar15] = uVar7;
      s->nUnits = s->nUnits + 1;
      uVar15 = *begin_00;
      iVar8 = (int)uVar15 >> 1;
      uVar10 = (uint)s->assigns[iVar8];
      if (uVar10 != 3) {
        if ((uVar15 & 1) == uVar10) {
          return uVar7;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x551,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
      }
      s->assigns[iVar8] = (byte)uVar15 & 1;
      s->levels[iVar8] = (s->trail_lim).size;
      s->reasons[iVar8] = 0;
    }
    else {
      uVar15 = (s->Mem).uPageMask & uVar7;
      if (uVar15 == 0) goto LAB_008e5e51;
      piVar3 = ppiVar2[(int)uVar7 >> ((byte)(s->Mem).nPageSize & 0x1f)];
      c = (clause *)(piVar3 + (int)uVar15);
      proof_chain_start(s,c);
      if (0xfff < (uint)*c) {
        uVar13 = 1;
        do {
          uVar10 = piVar3[(long)(int)uVar15 + uVar13 + 1];
          if (uVar10 < 2) break;
          proof_chain_resolve(s,(clause *)0x0,(int)uVar10 >> 1);
          uVar13 = uVar13 + 1;
        } while (uVar13 < (uint)*c >> 0xb);
      }
      iVar8 = proof_chain_stop(s);
      iVar8 = clause2_create_new(s,(lit *)begin_00,(lit *)end_00,1,iVar8);
      uVar15 = (int)*begin_00 >> 1;
      if (((int)uVar15 < 0) || (s->size <= (int)uVar15)) goto LAB_008e5e8f;
      if (s->units[uVar15] != 0) goto LAB_008e5e8f;
      s->units[uVar15] = iVar8;
      s->nUnits = s->nUnits + 1;
      uVar15 = *begin_00;
      iVar8 = (int)uVar15 >> 1;
      uVar10 = (uint)s->assigns[iVar8];
      if (uVar10 != 3) {
        if ((uVar15 & 1) == uVar10) {
          return uVar7;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x560,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
      }
      s->assigns[iVar8] = (byte)uVar15 & 1;
      s->levels[iVar8] = (s->trail_lim).size;
      s->reasons[iVar8] = uVar7;
    }
    iVar8 = s->qtail;
    s->qtail = iVar8 + 1;
    s->trail[iVar8] = uVar15;
  }
  return uVar7;
}

Assistant:

int sat_solver2_addclause(sat_solver2* s, lit* begin, lit* end, int Id)
{
    cla Cid;
    lit *i,*j,*iFree = NULL;
    int maxvar, count, temp;
    assert( solver2_dlevel(s) == 0 );
    assert( begin < end );
    assert( Id != 0 );

    // copy clause into storage
    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver2_setnvars(s,maxvar+1);


    // delete duplicates
    for (i = j = begin + 1; i < end; i++)
    {
        if ( *(i-1) == lit_neg(*i) ) // tautology
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( *(i-1) != *i )
            *j++ = *i;
    }
    end = j;
    assert( begin < end );

    // coount the number of 0-literals
    count = 0;
    for ( i = begin; i < end; i++ )
    {
        // make sure all literals are unique
        assert( i == begin || lit_var(*(i-1)) != lit_var(*i) );
        // consider the value of this literal
        if ( var_value(s, lit_var(*i)) == lit_sign(*i) ) // this clause is always true
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( var_value(s, lit_var(*i)) == varX ) // unassigned literal
            iFree = i;
        else
            count++; // literal is 0
    }
    assert( count < end-begin ); // the clause cannot be UNSAT

    // swap variables to make sure the clause is watched using unassigned variable
    temp   = *iFree;
    *iFree = *begin;
    *begin = temp;

    // create a new clause
    Cid = clause2_create_new( s, begin, end, 0, 0 );
    if ( Id )
        clause2_set_id( s, Cid, Id );

    // handle unit clause
    if ( count+1 == end-begin )
    {
        if ( s->fProofLogging )
        {
            if ( count == 0 ) // original learned clause
            {
                var_set_unit_clause( s, lit_var(begin[0]), Cid );
                if ( !solver2_enqueue(s,begin[0],0) )
                    assert( 0 );
            }
            else
            {
                // Log production of top-level unit clause:
                int x, k, proof_id, CidNew;
                clause* c = clause2_read(s, Cid);
                proof_chain_start( s, c );
                clause_foreach_var( c, x, k, 1 )
                    proof_chain_resolve( s, NULL, x );
                proof_id = proof_chain_stop( s );
                // generate a new clause
                CidNew = clause2_create_new( s, begin, begin+1, 1, proof_id );
                var_set_unit_clause( s, lit_var(begin[0]), CidNew );
                if ( !solver2_enqueue(s,begin[0],Cid) )
                    assert( 0 );
            }
        }
    }
    return Cid;
}